

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Backpack.cpp
# Opt level: O2

int __thiscall Backpack::remove(Backpack *this,char *__filename)

{
  pointer ppBVar1;
  int iVar2;
  iterator iVar3;
  
  std::operator<<((ostream *)&std::cout,"class:Backpack method:remove\n");
  if (((int)__filename < 1) ||
     (ppBVar1 = (this->backpack).
                super__Vector_base<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>._M_impl.
                super__Vector_impl_data._M_start,
     (ulong)((long)(this->backpack).
                   super__Vector_base<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)ppBVar1 >> 3) <
     ((ulong)__filename & 0xffffffff))) {
    iVar2 = 0;
  }
  else {
    iVar3 = std::vector<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>::erase
                      (&this->backpack,
                       (const_iterator)(ppBVar1 + (((ulong)__filename & 0xffffffff) - 1)));
    iVar2 = (int)CONCAT71((int7)((ulong)iVar3._M_current >> 8),1);
  }
  return iVar2;
}

Assistant:

bool Backpack::remove(int index) {
    std::cout << "class:Backpack method:remove\n";
    if (index <= 0 || index > backpack.size()) {
        return false;
    }
    backpack.erase(backpack.begin() + index - 1);
    return true;
}